

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmOutputRequiredFilesCommand.cxx
# Opt level: O3

string * __thiscall
cmLBDepend::FullPath_abi_cxx11_
          (string *__return_storage_ptr__,cmLBDepend *this,char *fname,char *extraPath)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  DirectoryToFileToPathMapType *this_00;
  pointer pbVar2;
  pointer pcVar3;
  string *psVar4;
  bool bVar5;
  size_t sVar6;
  iterator iVar7;
  iterator iVar8;
  mapped_type *pmVar9;
  mapped_type *pmVar10;
  size_type sVar11;
  pointer pbVar12;
  char *pcVar13;
  string path;
  key_type local_b0;
  allocator<char> local_89;
  string *local_88;
  key_type local_80;
  char *local_60;
  key_type local_58;
  DirectoryToFileToPathMapType *local_38;
  
  paVar1 = &local_b0.field_2;
  local_88 = __return_storage_ptr__;
  local_b0._M_dataplus._M_p = (pointer)paVar1;
  if (extraPath == (char *)0x0) {
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"");
    iVar7 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
            ::find(&(this->DirectoryToFileToPathMap)._M_t,&local_b0);
  }
  else {
    sVar6 = strlen(extraPath);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,extraPath,extraPath + sVar6)
    ;
    iVar7 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
            ::find(&(this->DirectoryToFileToPathMap)._M_t,&local_b0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != paVar1) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  if ((_Rb_tree_header *)iVar7._M_node !=
      &(this->DirectoryToFileToPathMap)._M_t._M_impl.super__Rb_tree_header) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b0,fname,(allocator<char> *)&local_80);
    iVar8 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::find(iVar7._M_node + 2,&local_b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
    }
    psVar4 = local_88;
    if (iVar8._M_node != (_Base_ptr)&iVar7._M_node[2]._M_parent) {
      (local_88->_M_dataplus)._M_p = (pointer)&local_88->field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_88,*(long *)(iVar8._M_node + 2),
                 (long)&(iVar8._M_node[2]._M_parent)->_M_color + *(long *)(iVar8._M_node + 2));
      return psVar4;
    }
  }
  this_00 = &this->DirectoryToFileToPathMap;
  bVar5 = cmsys::SystemTools::FileExists(fname,true);
  if (bVar5) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b0,fname,(allocator<char> *)&local_80);
    cmsys::SystemTools::CollapseFullPath(local_88,&local_b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
    }
    pcVar13 = "";
    if (extraPath != (char *)0x0) {
      pcVar13 = extraPath;
    }
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    sVar6 = strlen(pcVar13);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,pcVar13,pcVar13 + sVar6);
    pmVar9 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
             ::operator[](this_00,&local_b0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_80,fname,(allocator<char> *)&local_58);
    pmVar10 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](pmVar9,&local_80);
    std::__cxx11::string::_M_assign((string *)pmVar10);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
LAB_001d81f8:
      operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
    }
LAB_001d8205:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
LAB_001d820f:
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    pbVar12 = (this->IncludeDirectories).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pbVar2 = (this->IncludeDirectories).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    local_60 = extraPath;
    local_38 = this_00;
    if (pbVar12 != pbVar2) {
      paVar1 = &local_80.field_2;
      do {
        local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
        pcVar3 = (pbVar12->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_b0,pcVar3,pcVar3 + pbVar12->_M_string_length);
        if (local_b0._M_string_length == 0) {
          sVar11 = 0;
        }
        else {
          sVar11 = local_b0._M_string_length;
          if (local_b0._M_dataplus._M_p[local_b0._M_string_length - 1] != '/') {
            local_80._M_dataplus._M_p = (pointer)paVar1;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_80,local_b0._M_dataplus._M_p,
                       local_b0._M_dataplus._M_p + local_b0._M_string_length);
            std::__cxx11::string::append((char *)&local_80);
            std::__cxx11::string::operator=((string *)&local_b0,(string *)&local_80);
            sVar11 = local_b0._M_string_length;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_80._M_dataplus._M_p != paVar1) {
              operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
              sVar11 = local_b0._M_string_length;
            }
          }
        }
        local_80._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_80,local_b0._M_dataplus._M_p,local_b0._M_dataplus._M_p + sVar11)
        ;
        std::__cxx11::string::append((char *)&local_80);
        std::__cxx11::string::operator=((string *)&local_b0,(string *)&local_80);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_80._M_dataplus._M_p != paVar1) {
          operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
        }
        bVar5 = cmsys::SystemTools::FileExists(&local_b0,true);
        if ((bVar5) && (bVar5 = cmsys::SystemTools::FileIsDirectory(&local_b0), !bVar5)) {
          cmsys::SystemTools::CollapseFullPath(local_88,&local_b0);
          pcVar13 = "";
          if (local_60 != (char *)0x0) {
            pcVar13 = local_60;
          }
          local_80._M_dataplus._M_p = (pointer)paVar1;
          sVar6 = strlen(pcVar13);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_80,pcVar13,pcVar13 + sVar6);
          pmVar9 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
                   ::operator[](local_38,&local_80);
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,fname,&local_89);
          pmVar10 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::operator[](pmVar9,&local_58);
          std::__cxx11::string::_M_assign((string *)pmVar10);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_58._M_dataplus._M_p != &local_58.field_2) {
            operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_80._M_dataplus._M_p != paVar1) {
            operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b0._M_dataplus._M_p == &local_b0.field_2) {
            return local_88;
          }
          goto LAB_001d820f;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
          operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
        }
        pbVar12 = pbVar12 + 1;
      } while (pbVar12 != pbVar2);
    }
    pcVar13 = local_60;
    if (local_60 != (char *)0x0) {
      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
      sVar6 = strlen(local_60);
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,pcVar13,pcVar13 + sVar6);
      if (local_b0._M_string_length == 0) {
        local_b0._M_string_length = 0;
      }
      else if (local_b0._M_dataplus._M_p[local_b0._M_string_length - 1] != '/') {
        local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_80,local_b0._M_dataplus._M_p,
                   local_b0._M_dataplus._M_p + local_b0._M_string_length);
        std::__cxx11::string::append((char *)&local_80);
        std::__cxx11::string::operator=((string *)&local_b0,(string *)&local_80);
        pcVar13 = local_60;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_80._M_dataplus._M_p != &local_80.field_2) {
          operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
          pcVar13 = local_60;
        }
      }
      paVar1 = &local_80.field_2;
      local_80._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_80,local_b0._M_dataplus._M_p,
                 local_b0._M_dataplus._M_p + local_b0._M_string_length);
      std::__cxx11::string::append((char *)&local_80);
      std::__cxx11::string::operator=((string *)&local_b0,(string *)&local_80);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != paVar1) {
        operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
      }
      bVar5 = cmsys::SystemTools::FileExists(&local_b0,true);
      if ((bVar5) && (bVar5 = cmsys::SystemTools::FileIsDirectory(&local_b0), !bVar5)) {
        cmsys::SystemTools::CollapseFullPath(local_88,&local_b0);
        local_80._M_dataplus._M_p = (pointer)paVar1;
        sVar6 = strlen(pcVar13);
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,pcVar13,pcVar13 + sVar6)
        ;
        pmVar9 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
                 ::operator[](local_38,&local_80);
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,fname,&local_89);
        pmVar10 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator[](pmVar9,&local_58);
        std::__cxx11::string::_M_assign((string *)pmVar10);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58._M_dataplus._M_p != &local_58.field_2) {
          operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_80._M_dataplus._M_p != paVar1) goto LAB_001d81f8;
        goto LAB_001d8205;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
      }
    }
    psVar4 = local_88;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_88,fname,(allocator<char> *)&local_b0);
    local_88 = psVar4;
  }
  return local_88;
}

Assistant:

std::string FullPath(const char* fname, const char* extraPath)
  {
    DirectoryToFileToPathMapType::iterator m;
    if (extraPath) {
      m = this->DirectoryToFileToPathMap.find(extraPath);
    } else {
      m = this->DirectoryToFileToPathMap.find("");
    }

    if (m != this->DirectoryToFileToPathMap.end()) {
      FileToPathMapType& map = m->second;
      FileToPathMapType::iterator p = map.find(fname);
      if (p != map.end()) {
        return p->second;
      }
    }

    if (cmSystemTools::FileExists(fname, true)) {
      std::string fp = cmSystemTools::CollapseFullPath(fname);
      this->DirectoryToFileToPathMap[extraPath ? extraPath : ""][fname] = fp;
      return fp;
    }

    for (std::string path : this->IncludeDirectories) {
      if (!path.empty() && path.back() != '/') {
        path = path + "/";
      }
      path = path + fname;
      if (cmSystemTools::FileExists(path, true) &&
          !cmSystemTools::FileIsDirectory(path)) {
        std::string fp = cmSystemTools::CollapseFullPath(path);
        this->DirectoryToFileToPathMap[extraPath ? extraPath : ""][fname] = fp;
        return fp;
      }
    }

    if (extraPath) {
      std::string path = extraPath;
      if (!path.empty() && path.back() != '/') {
        path = path + "/";
      }
      path = path + fname;
      if (cmSystemTools::FileExists(path, true) &&
          !cmSystemTools::FileIsDirectory(path)) {
        std::string fp = cmSystemTools::CollapseFullPath(path);
        this->DirectoryToFileToPathMap[extraPath][fname] = fp;
        return fp;
      }
    }

    // Couldn't find the file.
    return std::string(fname);
  }